

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_cached_string.c
# Opt level: O0

HT_Feature * ht_feature_cached_string_create(HT_Boolean thread_safe,HT_ErrorCode *out_err)

{
  HT_Mutex *pHVar1;
  HT_ErrorCode local_24;
  HT_FeatureCachedString *pHStack_20;
  HT_ErrorCode error_code;
  HT_FeatureCachedString *feature;
  HT_ErrorCode *out_err_local;
  HT_Boolean thread_safe_local;
  
  pHStack_20 = HT_FeatureCachedString_alloc();
  if (pHStack_20 == (HT_FeatureCachedString *)0x0) {
    local_24 = HT_ERR_OUT_OF_MEMORY;
    goto LAB_0010ac2d;
  }
  local_24 = ht_hash_map_init(&pHStack_20->static_hashes);
  if (local_24 == HT_ERR_OK) {
    local_24 = ht_hash_map_init(&pHStack_20->dynamic_hashes);
    if (local_24 == HT_ERR_OK) {
      if (thread_safe == 0) {
        pHStack_20->lock = (HT_Mutex *)0x0;
        goto LAB_0010ac2d;
      }
      pHVar1 = ht_mutex_create();
      pHStack_20->lock = pHVar1;
      if (pHStack_20->lock != (HT_Mutex *)0x0) goto LAB_0010ac2d;
      local_24 = HT_ERR_UNKNOWN;
      ht_hash_map_deinit(&pHStack_20->dynamic_hashes);
    }
    ht_hash_map_deinit(&pHStack_20->static_hashes);
  }
  ht_free(pHStack_20);
  pHStack_20 = (HT_FeatureCachedString *)0x0;
LAB_0010ac2d:
  if (out_err != (HT_ErrorCode *)0x0) {
    *out_err = local_24;
  }
  return &pHStack_20->base;
}

Assistant:

static HT_Feature*
ht_feature_cached_string_create(HT_Boolean thread_safe, HT_ErrorCode* out_err)
{
    HT_FeatureCachedString* feature = HT_FeatureCachedString_alloc();
    HT_ErrorCode error_code = HT_ERR_OK;

    if (feature == NULL)
    {
        error_code = HT_ERR_OUT_OF_MEMORY;
        goto create_finished;
    }

    error_code = ht_hash_map_init(&feature->static_hashes);
    if (error_code != HT_ERR_OK)
    {
        goto static_hashes_failed;
    }
    error_code = ht_hash_map_init(&feature->dynamic_hashes);
    if (error_code != HT_ERR_OK)
    {
        goto dynamic_hashes_failed;
    }

    if (thread_safe)
    {
        feature->lock = ht_mutex_create();
        if (feature->lock == NULL)
        {
            error_code = HT_ERR_UNKNOWN;
            goto lock_failed;
        }
    }
    else
    {
        feature->lock = NULL;
    }
    goto create_finished;

lock_failed:
    ht_hash_map_deinit(&feature->dynamic_hashes);
dynamic_hashes_failed:
    ht_hash_map_deinit(&feature->static_hashes);
static_hashes_failed:
    ht_free(feature);
    feature = NULL;
create_finished:
    HT_SET_ERROR(out_err, error_code);
    return (HT_Feature*)feature;
}